

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema_common.c
# Opt level: O3

lysc_node_action * lysc_node_actions(lysc_node *node)

{
  lysc_node_action **pplVar1;
  lysc_node_action *plVar2;
  
  pplVar1 = lysc_node_actions_p(node);
  if (pplVar1 == (lysc_node_action **)0x0) {
    plVar2 = (lysc_node_action *)0x0;
  }
  else {
    plVar2 = *pplVar1;
  }
  return plVar2;
}

Assistant:

lysc_node_action *
lysc_node_actions(const struct lysc_node *node)
{
    struct lysc_node_action **actions;

    actions = lysc_node_actions_p((struct lysc_node *)node);
    if (actions) {
        return *actions;
    } else {
        return NULL;
    }
}